

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O0

object * find_stack_object_in_inventory(object *obj,object *start)

{
  _Bool _Var1;
  object *local_30;
  object *local_28;
  object *gear_obj;
  object *start_local;
  object *obj_local;
  
  local_30 = start;
  if (start == (object *)0x0) {
    local_30 = player->gear;
  }
  local_28 = local_30;
  while( true ) {
    if (local_28 == (object *)0x0) {
      return (object *)0x0;
    }
    _Var1 = object_is_equipped(player->body,local_28);
    if ((!_Var1) && (_Var1 = object_similar(local_28,obj,OSTACK_PACK), _Var1)) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

static const struct object *find_stack_object_in_inventory(const struct object *obj, const struct object *start)
{
	const struct object *gear_obj;
	for (gear_obj = (start) ? start : player->gear; gear_obj; gear_obj = gear_obj->next) {
		if (!object_is_equipped(player->body, gear_obj) &&
				object_similar(gear_obj, obj, OSTACK_PACK)) {
			/* We found the object */
			return gear_obj;
		}
	}

	return NULL;
}